

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

bool skip_utf8_bom(FILE *f)

{
  int iVar1;
  
  iVar1 = fgetc((FILE *)f);
  if (((iVar1 == 0xef) && (iVar1 = fgetc((FILE *)f), iVar1 == 0xbb)) &&
     (iVar1 = fgetc((FILE *)f), iVar1 == 0xbf)) {
    return true;
  }
  rewind((FILE *)f);
  return false;
}

Assistant:

bool skip_utf8_bom(FILE *f) {

    // pretty straightforward, but works
    if (fgetc(f) == 0xEF) {
        if (fgetc(f) == 0xBB) {
            if (fgetc(f) == 0xBF) {
                return true;
            }
        }
    }

    rewind(f);
    return false;
}